

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcpLightCfg.c
# Opt level: O3

void XcpLightCfg_readFromAddress(uint8_t *source,uint8_t length,uint8_t *buffer)

{
  long lVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,length) != 0 && source != (uint8_t *)0x0) {
    lVar1 = 0;
    do {
      buffer[lVar1] = source[lVar1];
      lVar1 = lVar1 + 1;
    } while (length != (uint8_t)lVar1);
  }
  return;
}

Assistant:

void XcpLightCfg_readFromAddress(uint8_t *source, uint8_t length, uint8_t *buffer)
{
  if (source)
  {
    while (length)
    {
      *buffer = (*source);
      buffer++;
      source++;
      length--;
    }
  }
}